

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O2

int fits_unshuffle_4bytes(char *heap,LONGLONG length,int *status)

{
  int extraout_EAX;
  void *__src;
  long lVar1;
  long lVar2;
  
  __src = malloc(length * 4);
  lVar1 = 0;
  lVar2 = 0;
  if (0 < length) {
    lVar2 = length;
  }
  for (; -lVar1 != lVar2; lVar1 = lVar1 + -1) {
    *(char *)((long)__src + lVar1 * 4 + length * 4 + -1) = heap[lVar1 + length * 4 + -1];
    *(char *)((long)__src + lVar1 * 4 + length * 4 + -2) = heap[lVar1 + length * 3 + -1];
    *(char *)((long)__src + lVar1 * 4 + length * 4 + -3) = heap[lVar1 + length * 2 + -1];
    *(char *)((long)__src + lVar1 * 4 + length * 4 + -4) = heap[lVar1 + length + -1];
  }
  memcpy(heap,__src,length * 4);
  free(__src);
  return extraout_EAX;
}

Assistant:

static int fits_unshuffle_4bytes(char *heap, LONGLONG length, int *status)

/* unshuffle the bytes in an array of 4-byte integers or floats */

{
    LONGLONG ii;
    char *ptr, *cptr, *heapptr;
    
    ptr = malloc((size_t) (length * 4));
    heapptr = heap + (4 * length) -1;
    cptr = ptr + (4 * length) -1;
 
    for (ii = 0; ii < length; ii++) {
       *cptr = *heapptr;
       cptr--;
       *cptr = *(heapptr - length);
       cptr--;
       *cptr = *(heapptr - (2 * length));
       cptr--;
       *cptr = *(heapptr - (3 * length));
       cptr--;
       heapptr--;
    }
        
    memcpy(heap, ptr, (size_t) (length * 4));
    free(ptr);
    return(*status);
}